

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print(json_value *value,int indent)

{
  char *__format;
  char *local_40;
  char *local_38;
  int local_24;
  json_value *pjStack_20;
  int i_1;
  json_value *it;
  int i;
  int indent_local;
  json_value *value_local;
  
  for (it._0_4_ = 0; (int)it < indent; it._0_4_ = (int)it + 1) {
    printf("    ");
  }
  if (value->name != (char *)0x0) {
    printf("\"%s\" = ",value->name);
  }
  switch(value->type) {
  case JSON_NULL:
    printf("null\n");
    break;
  case JSON_OBJECT:
  case JSON_ARRAY:
    if (value->type == JSON_OBJECT) {
      local_38 = "{\n";
    }
    else {
      local_38 = "[\n";
    }
    printf(local_38);
    for (pjStack_20 = value->first_child; pjStack_20 != (json_value *)0x0;
        pjStack_20 = pjStack_20->next_sibling) {
      print(pjStack_20,indent + 1);
    }
    for (local_24 = 0; local_24 < indent; local_24 = local_24 + 1) {
      printf("    ");
    }
    if (value->type == JSON_OBJECT) {
      local_40 = "}\n";
    }
    else {
      local_40 = "]\n";
    }
    printf(local_40);
    break;
  case JSON_STRING:
    printf("\"%s\"\n",(value->field_5).string_value);
    break;
  case JSON_INT:
    printf("%d\n",(ulong)(uint)(value->field_5).int_value);
    break;
  case JSON_FLOAT:
    printf("%f\n",(double)(value->field_5).float_value);
    break;
  case JSON_BOOL:
    __format = "false\n";
    if ((value->field_5).int_value != 0) {
      __format = "true\n";
    }
    printf(__format);
  }
  return;
}

Assistant:

void print(json_value *value, int indent = 0)
{
	INDENT(indent);
	if (value->name) printf("\"%s\" = ", value->name);
	switch(value->type)
	{
	case JSON_NULL:
		printf("null\n");
		break;
	case JSON_OBJECT:
	case JSON_ARRAY:
		printf(value->type == JSON_OBJECT ? "{\n" : "[\n");
		for (json_value *it = value->first_child; it; it = it->next_sibling)
		{
			print(it, indent + 1);
		}
		INDENT(indent);
		printf(value->type == JSON_OBJECT ? "}\n" : "]\n");
		break;
	case JSON_STRING:
		printf("\"%s\"\n", value->string_value);
		break;
	case JSON_INT:
		printf("%d\n", value->int_value);
		break;
	case JSON_FLOAT:
		printf("%f\n", value->float_value);
		break;
	case JSON_BOOL:
		printf(value->int_value ? "true\n" : "false\n");
		break;
	}
}